

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O1

PVIPNode * pvip_node_alloc(pvip_t *pvip)

{
  int iVar1;
  pvip_arena *ppVar2;
  undefined8 *__ptr;
  PVIP_category_t PVar3;
  pvip_arena *ppVar4;
  PVIPNode *extraout_RAX;
  undefined8 *__ptr_00;
  long lVar5;
  undefined8 *puVar6;
  
  ppVar2 = pvip->arena;
  if (ppVar2->idx == 0x400) {
    __ptr_00 = (undefined8 *)0x6010;
    ppVar4 = (pvip_arena *)malloc(0x6010);
    if (ppVar4 == (pvip_arena *)0x0) {
      pvip_node_alloc_cold_1();
      __ptr = (undefined8 *)*__ptr_00;
      while (__ptr != (undefined8 *)0x0) {
        if (0 < *(int *)(__ptr + 1)) {
          puVar6 = __ptr + 4;
          lVar5 = 0;
          do {
            PVar3 = PVIP_node_category(*(PVIP_node_type_t *)(puVar6 + -2));
            if (PVar3 == PVIP_CATEGORY_STRING) {
              PVIP_string_destroy((PVIPString *)puVar6[-1]);
            }
            else if (PVar3 == PVIP_CATEGORY_CHILDREN) {
              free((void *)*puVar6);
            }
            lVar5 = lVar5 + 1;
            puVar6 = puVar6 + 3;
          } while (lVar5 < *(int *)(__ptr + 1));
        }
        puVar6 = (undefined8 *)*__ptr;
        free(__ptr);
        __ptr = puVar6;
      }
      free(__ptr_00);
      return extraout_RAX;
    }
    ppVar4->next = ppVar2;
    pvip->arena = ppVar4;
  }
  ppVar2 = pvip->arena;
  iVar1 = ppVar2->idx;
  ppVar2->idx = iVar1 + 1;
  return ppVar2->nodes + iVar1;
}

Assistant:

PVIPNode* pvip_node_alloc(struct pvip_t* pvip) {
    if (pvip->arena->idx==PVIP_ARENA_SIZE) {
        struct pvip_arena* arena = malloc(sizeof(struct pvip_arena));
        ALLOC_CHECK(arena);
        arena->next = pvip->arena;
        pvip->arena = arena;
    }
    return &(pvip->arena->nodes[pvip->arena->idx++]);
}